

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_truncated.h
# Opt level: O0

size_t __thiscall
absl::lts_20250127::log_internal::AppendTruncated
          (log_internal *this,string_view src,Span<char> *dst)

{
  size_type sVar1;
  size_type sVar2;
  pointer __dest;
  const_pointer __src;
  Span<char> *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  Span<char> *local_30;
  char *local_28;
  Span<char> *dst_local;
  string_view src_local;
  
  this_00 = (Span<char> *)src._M_str;
  src_local._M_len = src._M_len;
  dst_local = (Span<char> *)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  sVar2 = Span<char>::size(this_00);
  if (sVar2 < sVar1) {
    sVar1 = Span<char>::size(this_00);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local,0,sVar1);
    local_30 = (Span<char> *)bVar3._M_len;
    dst_local = local_30;
    local_28 = bVar3._M_str;
    src_local._M_len = (size_t)local_28;
  }
  __dest = Span<char>::data(this_00);
  __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  memcpy(__dest,__src,sVar1);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  Span<char>::remove_prefix(this_00,sVar1);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  return sVar1;
}

Assistant:

inline size_t AppendTruncated(absl::string_view src, absl::Span<char> &dst) {
  if (src.size() > dst.size()) src = src.substr(0, dst.size());
  memcpy(dst.data(), src.data(), src.size());
  dst.remove_prefix(src.size());
  return src.size();
}